

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::FundUtxoJsonData,_cfd::js::api::FundUtxoJsonDataStruct>::
ConvertFromStruct(JsonObjectVector<cfd::js::api::json::FundUtxoJsonData,_cfd::js::api::FundUtxoJsonDataStruct>
                  *this,vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
                        *list)

{
  bool bVar1;
  undefined1 local_120 [8];
  FundUtxoJsonData object;
  FundUtxoJsonDataStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
  *__range3;
  vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
  *list_local;
  JsonObjectVector<cfd::js::api::json::FundUtxoJsonData,_cfd::js::api::FundUtxoJsonDataStruct>
  *this_local;
  
  __end0 = std::
           vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
           ::begin(list);
  element = (FundUtxoJsonDataStruct *)
            std::
            vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>
            ::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cfd::js::api::FundUtxoJsonDataStruct_*,_std::vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>_>
                                *)&element);
    if (!bVar1) break;
    object._224_8_ =
         __gnu_cxx::
         __normal_iterator<const_cfd::js::api::FundUtxoJsonDataStruct_*,_std::vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>_>
         ::operator*(&__end0);
    js::api::json::FundUtxoJsonData::FundUtxoJsonData((FundUtxoJsonData *)local_120);
    js::api::json::FundUtxoJsonData::ConvertFromStruct
              ((FundUtxoJsonData *)local_120,(FundUtxoJsonDataStruct *)object._224_8_);
    std::
    vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::FundUtxoJsonData>).
                 super_vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
                ,(value_type *)local_120);
    js::api::json::FundUtxoJsonData::~FundUtxoJsonData((FundUtxoJsonData *)local_120);
    __gnu_cxx::
    __normal_iterator<const_cfd::js::api::FundUtxoJsonDataStruct_*,_std::vector<cfd::js::api::FundUtxoJsonDataStruct,_std::allocator<cfd::js::api::FundUtxoJsonDataStruct>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }